

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O2

void binbuf_addv(_binbuf *x,char *fmt,...)

{
  char cVar1;
  char in_AL;
  uint uVar2;
  undefined8 in_RCX;
  ulong uVar3;
  undefined8 in_RDX;
  word *pwVar4;
  undefined8 in_R8;
  word *pwVar5;
  word *pwVar6;
  undefined8 in_R9;
  ulong uVar7;
  long lVar8;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  word local_708 [4];
  undefined8 local_6e8;
  undefined8 local_6e0;
  undefined4 local_6d8;
  undefined8 local_6c8;
  undefined8 local_6b8;
  undefined8 local_6a8;
  undefined8 local_698;
  undefined8 local_688;
  undefined8 local_678;
  undefined8 local_668;
  t_atom arg [100];
  
  local_708[2] = (word)in_RDX;
  local_708[3] = (word)in_RCX;
  local_6e8 = in_R8;
  local_6e0 = in_R9;
  if (in_AL != '\0') {
    local_6d8 = in_XMM0_Da;
    local_6c8 = in_XMM1_Qa;
    local_6b8 = in_XMM2_Qa;
    local_6a8 = in_XMM3_Qa;
    local_698 = in_XMM4_Qa;
    local_688 = in_XMM5_Qa;
    local_678 = in_XMM6_Qa;
    local_668 = in_XMM7_Qa;
  }
  pwVar6 = (word *)&stack0x00000008;
  uVar2 = 0x10;
  uVar3 = 0x30;
  pwVar4 = &arg[0].a_w;
  for (lVar8 = 0; (int)lVar8 != 100; lVar8 = lVar8 + 1) {
    cVar1 = fmt[lVar8];
    if (cVar1 == ',') {
      ((t_atom *)(pwVar4 + -1))->a_type = A_COMMA;
LAB_00162828:
      pwVar4->w_float = 0.0;
    }
    else {
      if (cVar1 == ';') {
        ((t_atom *)(pwVar4 + -1))->a_type = A_SEMI;
        goto LAB_00162828;
      }
      if (cVar1 == 'f') {
        ((t_atom *)(pwVar4 + -1))->a_type = A_FLOAT;
        if ((uint)uVar3 < 0xa1) {
          pwVar5 = (word *)((long)local_708 + uVar3);
          uVar3 = (ulong)((uint)uVar3 + 0x10);
        }
        else {
          pwVar5 = pwVar6;
          pwVar6 = pwVar6 + 1;
        }
        pwVar4->w_float = (float)(double)*pwVar5;
      }
      else {
        uVar7 = (ulong)uVar2;
        if (cVar1 == 's') {
          ((t_atom *)(pwVar4 + -1))->a_type = A_SYMBOL;
          if (uVar2 < 0x29) {
            uVar2 = uVar2 + 8;
            pwVar5 = (word *)((long)local_708 + uVar7);
          }
          else {
            pwVar5 = pwVar6;
            pwVar6 = pwVar6 + 1;
          }
          *pwVar4 = *pwVar5;
        }
        else {
          if (cVar1 != 'i') goto LAB_00162889;
          pwVar4[-1].w_float = 1.4013e-45;
          if (uVar2 < 0x29) {
            uVar2 = uVar2 + 8;
            pwVar5 = (word *)((long)local_708 + uVar7);
          }
          else {
            pwVar5 = pwVar6;
            pwVar6 = pwVar6 + 1;
          }
          pwVar4->w_float = (float)pwVar5->w_index;
        }
      }
    }
    pwVar4 = pwVar4 + 2;
  }
  pd_error((void *)0x0,"binbuf_addmessv: only %d allowed",100);
LAB_00162889:
  binbuf_add(x,(int)lVar8,arg);
  return;
}

Assistant:

void binbuf_addv(t_binbuf *x, const char *fmt, ...)
{
    va_list ap;
    t_atom arg[MAXADDMESSV], *at =arg;
    int nargs = 0;
    const char *fp = fmt;

    va_start(ap, fmt);
    while (1)
    {
        if (nargs >= MAXADDMESSV)
        {
            pd_error(0, "binbuf_addmessv: only %d allowed", MAXADDMESSV);
            break;
        }
        switch(*fp++)
        {
        case 'i': SETFLOAT(at, va_arg(ap, int)); break;
        case 'f': SETFLOAT(at, va_arg(ap, double)); break;
        case 's': SETSYMBOL(at, va_arg(ap, t_symbol *)); break;
        case ';': SETSEMI(at); break;
        case ',': SETCOMMA(at); break;
        default: goto done;
        }
        at++;
        nargs++;
    }
done:
    va_end(ap);
    binbuf_add(x, nargs, arg);
}